

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O1

void __thiscall seq_precede_inc::~seq_precede_inc(seq_precede_inc *this)

{
  int *piVar1;
  Tint *pTVar2;
  IntVar **__ptr;
  
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__seq_precede_inc_00210bc0;
  piVar1 = (this->limit_change).data;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  (this->limit_change).data = (int *)0x0;
  piVar1 = (this->first_change).data;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
  }
  (this->first_change).data = (int *)0x0;
  pTVar2 = (this->limit_val).data;
  if (pTVar2 != (Tint *)0x0) {
    free(pTVar2);
  }
  (this->limit_val).data = (Tint *)0x0;
  pTVar2 = (this->first_val).data;
  if (pTVar2 != (Tint *)0x0) {
    free(pTVar2);
  }
  (this->first_val).data = (Tint *)0x0;
  pTVar2 = (this->limit).data;
  if (pTVar2 != (Tint *)0x0) {
    free(pTVar2);
  }
  (this->limit).data = (Tint *)0x0;
  pTVar2 = (this->first).data;
  if (pTVar2 != (Tint *)0x0) {
    free(pTVar2);
  }
  (this->first).data = (Tint *)0x0;
  __ptr = (this->xs).data;
  if (__ptr != (IntVar **)0x0) {
    free(__ptr);
  }
  (this->xs).data = (IntVar **)0x0;
  return;
}

Assistant:

Clause* ex_ub(int xi, int k) {
		Clause* r = Reason_new(xi + 1);

		// One of the predecessors must be (at least) k.
		for (int ii = 0; ii < xi; ++ii) {
			(*r)[ii + 1] = xs[ii]->getLit(k, LR_GE);
		}
		return r;
	}